

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O2

void crnlib::RcTree_ReverseEncode(CRangeEnc *rc,UInt16 *probs,int numBitLevels,UInt32 symbol)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  
  iVar1 = 0;
  if (0 < numBitLevels) {
    iVar1 = numBitLevels;
  }
  uVar2 = 1;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    RangeEnc_EncodeBit(rc,probs + uVar2,symbol & 1);
    uVar2 = (ulong)((symbol & 1) + (int)uVar2 * 2);
    symbol = symbol >> 1;
  }
  return;
}

Assistant:

static void RcTree_ReverseEncode(CRangeEnc* rc, CLzmaProb* probs, int numBitLevels, UInt32 symbol) {
  UInt32 m = 1;
  int i;
  for (i = 0; i < numBitLevels; i++) {
    UInt32 bit = symbol & 1;
    RangeEnc_EncodeBit(rc, probs + m, bit);
    m = (m << 1) | bit;
    symbol >>= 1;
  }
}